

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O3

ScalarFunction * duckdb::UrlEncodeFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_a1;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  code *local_88;
  LogicalType local_80 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(local_38,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_38;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_68,__l,&local_a1);
  duckdb::LogicalType::LogicalType(local_80,VARCHAR);
  local_98 = 0;
  local_a0 = URLEncodeFunction;
  local_88 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_50,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_50);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,3);
  }
  duckdb::LogicalType::~LogicalType(local_80);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  duckdb::LogicalType::~LogicalType(local_38);
  return in_RDI;
}

Assistant:

ScalarFunction UrlEncodeFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, URLEncodeFunction);
}